

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

Var __thiscall Minisat::SimpSolver::newVar(SimpSolver *this,bool sign,bool dvar)

{
  Var n;
  char local_2c [4];
  int local_28 [2];
  
  n = Solver::newVar(&this->super_Solver,sign,dvar);
  local_2c[2] = 0;
  vec<char>::push(&this->frozen,local_2c + 2);
  local_2c[1] = 0;
  vec<char>::push(&this->eliminated,local_2c + 1);
  if (this->use_simplification == true) {
    local_28[1] = 0;
    vec<int>::push(&this->n_occ,local_28 + 1);
    local_28[0] = 0;
    vec<int>::push(&this->n_occ,local_28);
    vec<Minisat::vec<unsigned_int>_>::growTo(&(this->occurs).occs,n + 1);
    local_2c[3] = 0;
    vec<char>::growTo(&(this->occurs).dirty,n + 1,local_2c + 3);
    local_2c[0] = '\0';
    vec<char>::push(&this->touched,local_2c);
    Heap<Minisat::SimpSolver::ElimLt>::insert(&this->elim_heap,n);
  }
  return n;
}

Assistant:

Var SimpSolver::newVar(bool sign, bool dvar)
{
    Var v = Solver::newVar(sign, dvar);

    frozen.push((char)false);
    eliminated.push((char)false);

    if (use_simplification) {
        n_occ.push(0);
        n_occ.push(0);
        occurs.init(v);
        touched.push(0);
        elim_heap.insert(v);
    }

    // TODO: make sure to add new data structures also to reserveVars below!

    return v;
}